

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe_method.cpp
# Opt level: O3

int __thiscall RNG::generate(RNG *this,int from,int to)

{
  result_type rVar1;
  Probe probe;
  uniform_int_distribution<int> dist;
  Probe local_40;
  uniform_int_distribution<int> local_20;
  
  local_40._done = false;
  local_40._mark = &this->_generate_mark;
  local_40._start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_40._stop.__d.__r = (duration)0;
  local_20._M_param._M_a = from;
  local_20._M_param._M_b = to;
  rVar1 = std::uniform_int_distribution<int>::operator()(&local_20,&this->_rd,&local_20._M_param);
  bm::GenericBench<std::chrono::_V2::steady_clock>::Probe::done(&local_40);
  return rVar1;
}

Assistant:

int generate(int from, int to)
    {
        Bench::Probe probe(_generate_mark);

		std::uniform_int_distribution<int> dist(from, to);
        return dist(_rd);
    }